

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

bool __thiscall BufferedReader::incSeek(BufferedReader *this,int readerID,int64_t offset)

{
  ReaderData *pRVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  bool rez;
  ReaderData *data;
  _Self local_38;
  iterator itr;
  lock_guard<std::mutex> lock;
  int64_t offset_local;
  BufferedReader *pBStack_18;
  int readerID_local;
  BufferedReader *this_local;
  
  offset_local._4_4_ = readerID;
  pBStack_18 = this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itr,&this->m_readersMtx);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::find(&this->m_readers,(key_type_conflict *)((long)&offset_local + 4));
  data = (ReaderData *)
         std::
         map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
         ::end(&this->m_readers);
  bVar2 = std::operator!=(&local_38,(_Self *)&data);
  if (bVar2) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator->(&local_38);
    pRVar1 = ppVar4->second;
    uVar3 = (*pRVar1->_vptr_ReaderData[2])(pRVar1,offset);
    this_local._7_1_ = (byte)uVar3 & 1;
    if ((uVar3 & 1) != 0) {
      pRVar1->m_eof = false;
      pRVar1->m_notified = false;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BufferedReader::incSeek(const int readerID, const int64_t offset)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    if (itr != m_readers.end())
    {
        ReaderData* data = itr->second;
        const bool rez = data->incSeek(offset);
        if (rez)
        {
            data->m_eof = false;
            data->m_notified = false;
        }
        return rez;
    }
    return false;
}